

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.h
# Opt level: O0

char16_t * icu_63::UCharsTrie::skipNodeValue(char16_t *pos,int32_t leadUnit)

{
  char16_t *pcStack_10;
  int32_t leadUnit_local;
  char16_t *pos_local;
  
  pcStack_10 = pos;
  if (0x403f < leadUnit) {
    if (leadUnit < 0x7fc0) {
      pcStack_10 = pos + 1;
    }
    else {
      pcStack_10 = pos + 2;
    }
  }
  return pcStack_10;
}

Assistant:

static inline const char16_t *skipNodeValue(const char16_t *pos, int32_t leadUnit) {
        // U_ASSERT(kMinValueLead<=leadUnit && leadUnit<kValueIsFinal);
        if(leadUnit>=kMinTwoUnitNodeValueLead) {
            if(leadUnit<kThreeUnitNodeValueLead) {
                ++pos;
            } else {
                pos+=2;
            }
        }
        return pos;
    }